

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::emergency_teardown(ThreadedReplayer *this)

{
  bool bVar1;
  pointer pDVar2;
  ThreadedReplayer *this_local;
  
  flush_pipeline_cache(this);
  flush_validation_cache(this);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->validation_whitelist_db);
  if (bVar1) {
    pDVar2 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->validation_whitelist_db);
    (*pDVar2->_vptr_DatabaseInterface[7])();
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->validation_blacklist_db);
  if (bVar1) {
    pDVar2 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->validation_blacklist_db);
    (*pDVar2->_vptr_DatabaseInterface[7])();
  }
  return;
}

Assistant:

void emergency_teardown()
	{
#ifdef SIMULATE_UNSTABLE_DRIVER
		spurious_deadlock();
#endif
		flush_pipeline_cache();
		flush_validation_cache();
		if (validation_whitelist_db)
			validation_whitelist_db->flush();
		if (validation_blacklist_db)
			validation_blacklist_db->flush();
	}